

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O3

int greatest_memory_equal_cb(void *expd,void *got,void *udata)

{
  int iVar1;
  
  iVar1 = bcmp(expd,got,*(size_t *)((long)udata + 0x10));
  return (int)(iVar1 == 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}